

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestCoherency::getReadPropertiesForTextureType
          (TextureViewTestCoherency *this,_texture_type texture_type,GLuint *out_to_id,
          uint *out_read_lod)

{
  TestError *this_00;
  uint *out_read_lod_local;
  GLuint *out_to_id_local;
  _texture_type texture_type_local;
  TextureViewTestCoherency *this_local;
  
  if (texture_type == TEXTURE_TYPE_PARENT_TEXTURE) {
    *out_to_id = this->m_view_to_id;
    *out_read_lod = 0;
  }
  else {
    if (texture_type != TEXTURE_TYPE_TEXTURE_VIEW) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized read source",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x21e1);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    *out_to_id = this->m_to_id;
    *out_read_lod = 2;
  }
  return;
}

Assistant:

void TextureViewTestCoherency::getReadPropertiesForTextureType(_texture_type texture_type, glw::GLuint* out_to_id,
															   unsigned int* out_read_lod) const
{
	switch (texture_type)
	{
	case TEXTURE_TYPE_PARENT_TEXTURE:
	{
		*out_to_id = m_view_to_id;

		/* We've modified LOD1 of parent texture which corresponds
		 * to LOD 0 from the view's PoV
		 */
		*out_read_lod = 0;

		break;
	}

	case TEXTURE_TYPE_TEXTURE_VIEW:
	{
		*out_to_id = m_to_id;

		/* We've modified LOD1 of the view texture which corresponds
		 * to LOD2 from parent texture's PoV.
		 */
		*out_read_lod = 2;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized read source");
	}
	} /* switch (texture_type) */
}